

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O1

void __thiscall pass_inline_pass_param_Test::TestBody(pass_inline_pass_param_Test *this)

{
  PassManager *pPVar1;
  pointer pcVar2;
  bool bVar3;
  Generator *this_00;
  Generator *child;
  Port *var;
  Var *pVVar4;
  Param *pPVar5;
  Expr *right;
  Var *this_01;
  Param *pPVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  undefined1 local_250 [8];
  Context ctx;
  undefined1 local_120 [8];
  shared_ptr<kratos::Attribute> attr;
  mapped_type src;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_b0 [32];
  AssertHelper local_90;
  undefined1 local_88 [8];
  VerilogModule vmod;
  
  local_250 = (undefined1  [8])&ctx.modules_._M_h._M_rehash_policy._M_next_resize;
  ctx.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  ctx.modules_._M_h._M_bucket_count = 0;
  ctx.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  ctx.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ctx.modules_._M_h._M_rehash_policy._4_4_ = 0;
  ctx.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  ctx.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&ctx.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  ctx.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  ctx.generator_hash_._M_h._M_bucket_count = 0;
  ctx.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&ctx.enum_defs_
  ;
  ctx.enum_defs_._M_t._M_impl._0_4_ = 0;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  ctx.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ctx.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  ctx.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  ctx.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&ctx.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  ctx.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  ctx.empty_generators_._M_h._M_bucket_count = 0;
  ctx.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  ctx._224_8_ = &ctx.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  ctx.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ctx.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  ctx.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  ctx.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  ctx.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  ctx.tracked_generators_._M_h._M_bucket_count = 0;
  ctx.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ctx.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  ctx.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  ctx.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  ctx.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  pPVar1 = &vmod.manager_;
  ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"mod","");
  this_00 = kratos::Context::generator((Context *)local_250,(string *)local_88);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"child","");
  child = kratos::Context::generator((Context *)local_250,(string *)local_88);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"inst","");
  kratos::Generator::add_child_generator(this_00,(string *)local_88,child);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"in1","");
  src.field_2._8_8_ = kratos::Generator::port(child,In,(string *)local_88,1,1);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"in2","");
  var = kratos::Generator::port(child,In,(string *)local_88,1,1);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"v","");
  pVVar4 = kratos::Generator::var(child,(string *)local_88,1);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"width","");
  pPVar5 = kratos::Generator::parameter(child,(string *)local_88,0x20);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  (*(pPVar5->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar5,4);
  (**(code **)(*(long *)src.field_2._8_8_ + 0x118))(src.field_2._8_8_,pPVar5);
  (*(var->super_Var).super_IRNode._vptr_IRNode[0x23])(var,pPVar5);
  (*(pVVar4->super_IRNode)._vptr_IRNode[0x23])(pVVar4,pPVar5);
  right = kratos::Var::operator&((Var *)src.field_2._8_8_,&var->super_Var);
  kratos::Generator::wire(child,pVVar4,&right->super_Var);
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"v1","");
  ctx.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)
       kratos::Generator::var(this_00,(string *)local_88,(uint32_t)(pPVar5->super_Const).value_);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"v2","");
  pVVar4 = kratos::Generator::var(this_00,(string *)local_88,(uint32_t)(pPVar5->super_Const).value_)
  ;
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"param1","");
  pPVar5 = kratos::Generator::parameter(child,(string *)local_88,0x20);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  (*(pPVar5->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar5,4);
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"v3","");
  this_01 = kratos::Generator::var(child,(string *)local_88,2,1);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  kratos::Var::set_size_param(this_01,0,(Var *)pPVar5);
  (*(this_01->super_IRNode)._vptr_IRNode[0x23])(this_01,pPVar5);
  kratos::Generator::wire
            (this_00,(Var *)src.field_2._8_8_,(Var *)ctx.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::wire(this_00,&var->super_Var,pVVar4);
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"p","");
  pPVar6 = kratos::Generator::parameter(this_00,(string *)local_88,0x20);
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  (*(pPVar6->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])(pPVar6,4);
  kratos::Var::as<kratos::Param>((Var *)local_88);
  kratos::Param::set_value(pPVar5,(shared_ptr<kratos::Param> *)local_88);
  if (vmod.generator_ != (Generator *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vmod.generator_);
  }
  kratos::fix_assignment_type(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::verify_assignments(this_00);
  local_120 = (undefined1  [8])0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x68);
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_dataplus._M_p = (pointer)0x100000001;
  (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Attribute =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002b8800;
  local_120 = (undefined1  [8])
              &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               type_str)._M_string_length;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_string_length = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           type_str).field_2 + 8) = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  _M_dataplus._M_p = (pointer)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  _M_string_length = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           value_str).field_2 + 8) = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]._vptr_Attribute =
       (_func_int **)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].type_str.
  _M_dataplus._M_p = (pointer)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_string_length = (size_type)&PTR__Attribute_002b8850;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  field_2._M_allocated_capacity =
       (size_type)
       &(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           type_str).field_2 + 8) = 0;
  *(undefined1 *)
   &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
    _M_dataplus._M_p = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  field_2._M_allocated_capacity =
       (size_type)
       &(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           value_str).field_2 + 8) = 0;
  *(undefined1 *)
   &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]._vptr_Attribute =
       (_func_int **)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].type_str.
  _M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->value_str).field_2,0,
             *(char **)((long)&((attr.
                                 super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->value_str).field_2 + 8),0x2479a7);
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)&(child->super_IRNode).attributes_,(shared_ptr<kratos::Attribute> *)local_120);
  kratos::inline_instance(this_00);
  local_88 = (undefined1  [8])pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"inst","");
  bVar3 = kratos::Generator::has_child_generator(this_00,(string *)local_88);
  local_e0[0] = (internal)!bVar3;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_88 != (undefined1  [8])pPVar1) {
    operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
  }
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)local_e0,
               (AssertionResult *)"mod.has_child_generator(\"inst\")","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x212,(char *)local_88);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_b0,
               (Message *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_88 != (undefined1  [8])pPVar1) {
      operator_delete((void *)local_88,vmod.manager_.passes_._M_t._M_impl._0_8_ + 1);
    }
    if (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[1])();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  kratos::VerilogModule::VerilogModule((VerilogModule *)local_88,this_00);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_e0,(VerilogModule *)local_88);
  local_b0._0_8_ = (AssertHelperData *)(local_b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"mod","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_e0,(key_type *)local_b0);
  pcVar2 = (pmVar7->_M_dataplus)._M_p;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&src._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pcVar2,pcVar2 + pmVar7->_M_string_length);
  if ((AssertHelperData *)local_b0._0_8_ != (AssertHelperData *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e0);
  local_b0._0_8_ =
       std::__cxx11::string::find
                 ((char *)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,0x250a11,0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_e0,"src.find(\"width\")","std::string::npos",
             (unsigned_long *)local_b0,&std::__cxx11::string::npos);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (gtest_ar_._0_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x216,pcVar8);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((AssertHelperData *)local_b0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  local_b0._0_8_ =
       std::__cxx11::string::find
                 ((char *)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,0x247a55,0);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_e0,"src.find(\"logic [p-1:0][p-1:0] v3;\")","std::string::npos",
             (unsigned_long *)local_b0,&std::__cxx11::string::npos);
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (gtest_ar_._0_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x217,pcVar8);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((AssertHelperData *)local_b0._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0._0_8_ + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  if (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&src._M_string_length) {
    operator_delete(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,src._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vmod.manager_.passes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
               *)&vmod);
  if (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&ctx.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&ctx.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&ctx.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&ctx.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_250);
  return;
}

Assistant:

TEST(pass, inline_pass_param) {
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    auto &param = child.parameter("width", 32);
    param.set_value(4);
    in1.set_width_param(&param);
    in2.set_width_param(&param);
    v.set_width_param(&param);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", param.value());
    auto &v2 = mod.var("v2", param.value());
    auto &param1 = child.parameter("param1", 32);
    param1.set_value(4);
    auto &v3 = child.var("v3", 2, 1);
    v3.set_size_param(0, &param1);
    v3.set_width_param(&param1);

    mod.wire(in1, v1);
    mod.wire(in2, v2);
    // will not be used
    auto &param1_ = mod.parameter("p", 32);
    param1_.set_value(4);
    param1.set_value(param1_.as<Param>());

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    auto attr = std::make_shared<Attribute>();
    attr->value_str = "inline";
    child.add_attribute(attr);

    inline_instance(&mod);

    EXPECT_FALSE(mod.has_child_generator("inst"));

    VerilogModule vmod(&mod);
    auto src = vmod.verilog_src()["mod"];
    EXPECT_EQ(src.find("width"), std::string::npos);
    EXPECT_NE(src.find("logic [p-1:0][p-1:0] v3;"), std::string::npos);
}